

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_fold.c
# Opt level: O2

int tryhash(uint32_t *htab,uint32_t sz,uint32_t r,int dorol)

{
  uint uVar1;
  ulong uVar2;
  byte bVar3;
  byte bVar4;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint *puVar10;
  ulong uVar11;
  long lVar12;
  sbyte sVar5;
  
  if ((dorol == 0) || (iVar6 = 0, 0x1f < r && (r & 0x1f) != 0)) {
    memset(htab,0xff,(ulong)sz * 4 + 4);
    uVar11 = (ulong)nkeys;
    for (lVar12 = 0; uVar11 << 2 != lVar12; lVar12 = lVar12 + 4) {
      uVar1 = *(uint *)((long)foldkeys + lVar12);
      uVar7 = uVar1 & 0xffffff;
      bVar4 = (byte)(r >> 5);
      sVar5 = (sbyte)(r & 0x1f);
      if (dorol == 0) {
        uVar7 = (uVar7 << (bVar4 & 0x1f)) - uVar7 << sVar5;
      }
      else {
        uVar7 = (uVar7 << (bVar4 & 0x1f) | uVar7 >> 0x20 - (bVar4 & 0x1f)) - uVar7;
        bVar3 = (byte)r & 0x1f;
        uVar7 = uVar7 << bVar3 | uVar7 >> 0x20 - bVar3;
      }
      uVar2 = (ulong)uVar7 % (ulong)sz;
      if (htab[uVar2] == 0xffffffff) {
        puVar10 = htab + uVar2;
      }
      else {
        uVar9 = (uint)uVar2;
        puVar10 = htab + uVar2 + 1;
        uVar7 = *puVar10;
        if (uVar7 != 0xffffffff) {
          if (sz - 1 <= uVar9) {
            return 0;
          }
          if (htab[(long)(int)uVar9 + 2] != 0xffffffff) {
            return 0;
          }
          uVar8 = uVar7 & 0xffffff;
          if (dorol == 0) {
            uVar8 = (uVar8 << (bVar4 & 0x1f)) - uVar8 << sVar5;
          }
          else {
            uVar8 = (uVar8 << (bVar4 & 0x1f) | uVar8 >> 0x20 - (bVar4 & 0x1f)) - uVar8;
            bVar4 = (byte)r & 0x1f;
            uVar8 = uVar8 << bVar4 | uVar8 >> 0x20 - bVar4;
          }
          if (uVar8 % sz != uVar9 + 1) {
            return 0;
          }
          htab[(long)(int)uVar9 + 2] = uVar7;
        }
      }
      *puVar10 = uVar1;
    }
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

static int tryhash(uint32_t *htab, uint32_t sz, uint32_t r, int dorol)
{
  uint32_t i;
  if (dorol && ((r & 31) == 0 || (r>>5) == 0))
    return 0;  /* Avoid zero rotates. */
  memset(htab, 0xff, (sz+1)*sizeof(uint32_t));
  for (i = 0; i < nkeys; i++) {
    uint32_t key = foldkeys[i];
    uint32_t k = key & 0xffffff;
    uint32_t h = (dorol ? lj_rol(lj_rol(k, r>>5) - k, r&31) :
			  (((k << (r>>5)) - k) << (r&31))) % sz;
    if (htab[h] != 0xffffffff) {  /* Collision on primary slot. */
      if (htab[h+1] != 0xffffffff) {  /* Collision on secondary slot. */
	/* Try to move the colliding key, if possible. */
	if (h < sz-1 && htab[h+2] == 0xffffffff) {
	  uint32_t k2 = htab[h+1] & 0xffffff;
	  uint32_t h2 = (dorol ? lj_rol(lj_rol(k2, r>>5) - k2, r&31) :
				 (((k2 << (r>>5)) - k2) << (r&31))) % sz;
	  if (h2 != h+1) return 0;  /* Cannot resolve collision. */
	  htab[h+2] = htab[h+1];  /* Move colliding key to secondary slot. */
	} else {
	  return 0;  /* Collision. */
	}
      }
      htab[h+1] = key;
    } else {
      htab[h] = key;
    }
  }
  return 1;  /* Success, all keys could be stored. */
}